

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

ON_Brep * __thiscall ON_Brep::SubBrep(ON_Brep *this,int subfi_count,int *subfi,ON_Brep *sub_brep)

{
  int *piVar1;
  ON_Object *src;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_BrepVertex *pOVar6;
  ulong newcap;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ON_3dPoint vertex_point;
  unsigned_short uVar24;
  unsigned_short uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  uint uVar30;
  int *__s;
  int *__s_00;
  ON_BrepLoop *pOVar31;
  ON_Brep *pOVar32;
  ON_BrepTrim *pOVar33;
  long lVar34;
  ON_BrepEdge *pOVar35;
  ON_BrepVertex *this_00;
  undefined4 extraout_var;
  ON_BrepEdge *this_01;
  undefined4 extraout_var_00;
  ON_BrepFace *pOVar36;
  ON_BrepLoop *loop;
  undefined4 extraout_var_01;
  ON_BrepTrim *pOVar37;
  long lVar38;
  ulong uVar39;
  char *sFormat;
  int iVar40;
  int iVar41;
  ON_BrepFace *pOVar42;
  ulong uVar43;
  long lVar44;
  ON_Brep *local_120;
  int local_100;
  int local_d8;
  ON_Curve *c2;
  LeakStopper local_b0;
  ON_BoundingBox sub_bbox;
  ON_Surface *srf;
  
  newcap = (ulong)(uint)subfi_count;
  ON_Workspace::ON_Workspace(&local_b0.super_ON_Workspace);
  local_b0.m_p = (ON_Brep *)0x0;
  local_b0.m_sub_brep = (ON_Brep *)0x0;
  if (sub_brep != (ON_Brep *)0x0) {
    Destroy(sub_brep);
  }
  if ((subfi == (int *)0x0 || subfi_count < 1) ||
     (local_100 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count, local_100 < subfi_count)) {
LAB_0043427c:
    local_120 = (ON_Brep *)0x0;
  }
  else {
    __s = ON_Workspace::GetIntMemory
                    (&local_b0.super_ON_Workspace,
                     (long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                           super_ON_ClassArray<ON_BrepEdge>.m_count);
    local_120 = (ON_Brep *)0x0;
    memset(__s,0,(long)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                       super_ON_ClassArray<ON_BrepEdge>.m_count << 2);
    __s_00 = ON_Workspace::GetIntMemory
                       (&local_b0.super_ON_Workspace,
                        (long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                              super_ON_ClassArray<ON_BrepVertex>.m_count);
    memset(__s_00,0,(long)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                          super_ON_ClassArray<ON_BrepVertex>.m_count << 2);
    local_d8 = -1;
    iVar2 = 0;
    iVar3 = 0;
    iVar4 = 0;
    iVar29 = 0;
    for (uVar43 = 0; uVar43 != newcap; uVar43 = uVar43 + 1) {
      iVar41 = subfi[uVar43];
      iVar40 = 0x443;
      if (((long)iVar41 < 0) ||
         ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
          iVar41)) {
        sFormat = "ON_Brep::SubBrep sub_fi[] has invalid indices";
LAB_00434573:
        local_120 = (ON_Brep *)0x0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_region.cpp"
                   ,iVar40,"",sFormat);
        goto LAB_00434285;
      }
      iVar40 = iVar41;
      iVar26 = local_100;
      if ((iVar41 <= local_d8) && (iVar40 = local_d8, iVar26 = iVar41, local_100 <= iVar41)) {
        uVar39 = 0;
        while (iVar26 = local_100, uVar43 != uVar39) {
          piVar1 = subfi + uVar39;
          uVar39 = uVar39 + 1;
          if (*piVar1 == iVar41) {
            iVar40 = 0x450;
            sFormat = "ON_Brep::SubBrep sub_fi[] has duplicate indices";
            goto LAB_00434573;
          }
        }
      }
      local_100 = iVar26;
      local_d8 = iVar40;
      pOVar42 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a +
                iVar41;
      for (iVar41 = 0; iVar41 < (pOVar42->m_li).m_count; iVar41 = iVar41 + 1) {
        pOVar31 = ON_BrepFace::Loop(pOVar42,iVar41);
        if ((pOVar31 == (ON_BrepLoop *)0x0) ||
           (pOVar32 = ON_BrepLoop::Brep(pOVar31), pOVar32 != this)) goto LAB_00434285;
        iVar29 = iVar29 + 1;
        for (iVar40 = 0; iVar40 < (pOVar31->m_ti).m_count; iVar40 = iVar40 + 1) {
          pOVar33 = ON_BrepLoop::Trim(pOVar31,iVar40);
          if ((pOVar33 == (ON_BrepTrim *)0x0) ||
             (pOVar32 = ON_BrepTrim::Brep(pOVar33), pOVar32 != this)) goto LAB_00434285;
          lVar34 = (long)pOVar33->m_vi[0];
          if ((lVar34 < 0) ||
             (((uVar30 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                         super_ON_ClassArray<ON_BrepVertex>.m_count, (int)uVar30 <= pOVar33->m_vi[0]
               || (uVar5 = pOVar33->m_vi[1], (int)uVar5 < 0)) || (uVar30 <= uVar5))))
          goto LAB_00434285;
          if (__s_00[lVar34] == 0) {
            __s_00[lVar34] = 1;
            iVar2 = iVar2 + 1;
            uVar5 = pOVar33->m_vi[1];
          }
          if (__s_00[(int)uVar5] == 0) {
            __s_00[(int)uVar5] = 1;
            iVar2 = iVar2 + 1;
          }
          if ((pOVar33->m_type | mated) == ptonsrf) {
            if ((-1 < pOVar33->m_ei) || (pOVar33->m_vi[0] != pOVar33->m_vi[1])) goto LAB_00434285;
          }
          else {
            if (((pOVar33->m_ei < 0) ||
                (pOVar35 = ON_BrepTrim::Edge(pOVar33), pOVar35 == (ON_BrepEdge *)0x0)) ||
               (pOVar32 = ON_BrepEdge::Brep(pOVar35), pOVar32 != this)) goto LAB_00434285;
            if (__s[pOVar33->m_ei] == 0) {
              __s[pOVar33->m_ei] = 1;
              if ((__s_00[pOVar35->m_vi[0]] == 0) || (__s_00[pOVar35->m_vi[1]] == 0))
              goto LAB_00434285;
              iVar3 = iVar3 + 1;
            }
          }
        }
        iVar4 = iVar4 + iVar40;
      }
    }
    pOVar32 = sub_brep;
    if (sub_brep == (ON_Brep *)0x0) {
      sub_brep = New();
      local_b0.m_p = sub_brep;
      pOVar32 = local_b0.m_sub_brep;
    }
    local_b0.m_sub_brep = pOVar32;
    ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&sub_brep->m_F,newcap);
    ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&sub_brep->m_L,(long)iVar29);
    ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&sub_brep->m_T,(long)iVar4);
    ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&sub_brep->m_E,(long)iVar3);
    ON_ClassArray<ON_BrepVertex>::Reserve
              ((ON_ClassArray<ON_BrepVertex> *)&sub_brep->m_V,(long)iVar2);
    ON_SimpleArray<ON_Surface_*>::Reserve
              (&(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>,newcap);
    ON_SimpleArray<ON_Curve_*>::Reserve
              (&(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)iVar4);
    ON_SimpleArray<ON_Curve_*>::Reserve
              (&(sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)iVar3);
    lVar44 = 0;
    for (lVar34 = 0;
        lVar34 < (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_count; lVar34 = lVar34 + 1) {
      if (__s_00[lVar34] == 0) {
        __s_00[lVar34] = -1;
      }
      else {
        pOVar6 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_a;
        vertex_point.z = *(double *)((long)&(pOVar6->super_ON_Point).point.z + lVar44);
        vertex_point._0_16_ =
             *(undefined1 (*) [16])((long)&(pOVar6->super_ON_Point).point.x + lVar44);
        this_00 = NewVertex(sub_brep,vertex_point,*(double *)((long)&pOVar6->m_tolerance + lVar44));
        __s_00[lVar34] = this_00->m_vertex_index;
        ON_Object::CopyUserData
                  ((ON_Object *)this_00,
                   (ON_Object *)
                   ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                           _vptr_ON_Object + lVar44));
        this_00->m_vertex_user = *(ON_U *)((long)&pOVar6->m_vertex_user + lVar44);
      }
      lVar44 = lVar44 + 0x58;
    }
    local_120 = (ON_Brep *)0x0;
    lVar34 = 0;
    for (lVar44 = 0;
        lVar44 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_count; lVar44 = lVar44 + 1) {
      if (__s[lVar44] == 0) {
        __s[lVar44] = -1;
      }
      else {
        pOVar35 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
        ;
        if ((__s_00[*(int *)((long)pOVar35->m_vi + lVar34)] < 0) ||
           (__s_00[*(int *)((long)pOVar35->m_vi + lVar34 + 4)] < 0)) goto LAB_00434285;
        src = (ON_Object *)
              ((long)&(((ON_CurveProxy *)(&(pOVar35->super_ON_CurveProxy).m_real_curve_domain + -2))
                      ->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar34);
        iVar29 = (*src->_vptr_ON_Object[0x24])(src);
        sub_bbox.m_min.x = (double)CONCAT44(extraout_var,iVar29);
        if (sub_bbox.m_min.x == 0.0) goto LAB_0043427c;
        ON_SimpleArray<ON_Curve_*>::Append
                  (&(sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&sub_bbox);
        pOVar6 = (sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                 super_ON_ClassArray<ON_BrepVertex>.m_a;
        this_01 = NewEdge(sub_brep,pOVar6 + __s_00[*(int *)((long)pOVar35->m_vi + lVar34)],
                          pOVar6 + __s_00[*(int *)((long)pOVar35->m_vi + lVar34 + 4)],
                          (sub_brep->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count + -1,
                          (ON_Interval *)0x0,*(double *)((long)pOVar35->m_vi + lVar34 + 0x24));
        __s[lVar44] = this_01->m_edge_index;
        ON_Object::CopyUserData((ON_Object *)this_01,src);
        this_01->m_edge_user = *(ON_U *)((long)pOVar35->m_vi + lVar34 + -0x14);
      }
      lVar34 = lVar34 + 0x88;
    }
    bVar27 = ON_BoundingBox::IsValid(&this->m_bbox);
    ON_BoundingBox::ON_BoundingBox(&sub_bbox);
    for (uVar43 = 0; uVar43 != newcap; uVar43 = uVar43 + 1) {
      pOVar36 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      pOVar42 = pOVar36 + subfi[uVar43];
      iVar29 = (*pOVar36[subfi[uVar43]].super_ON_SurfaceProxy.super_ON_Surface.super_ON_Geometry.
                 super_ON_Object._vptr_ON_Object[0x24])();
      srf = (ON_Surface *)CONCAT44(extraout_var_00,iVar29);
      if (srf == (ON_Surface *)0x0) goto LAB_0043427c;
      ON_SimpleArray<ON_Surface_*>::Append(&(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>,&srf)
      ;
      pOVar36 = NewFace(sub_brep,(sub_brep->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count + -1);
      ON_Object::CopyUserData((ON_Object *)pOVar36,(ON_Object *)pOVar42);
      pOVar36->m_bRev = pOVar42->m_bRev;
      pOVar36->m_face_material_channel = pOVar42->m_face_material_channel;
      uVar24 = (pOVar42->m_face_uuid).Data2;
      uVar25 = (pOVar42->m_face_uuid).Data3;
      uVar18 = *(undefined8 *)(pOVar42->m_face_uuid).Data4;
      (pOVar36->m_face_uuid).Data1 = (pOVar42->m_face_uuid).Data1;
      (pOVar36->m_face_uuid).Data2 = uVar24;
      (pOVar36->m_face_uuid).Data3 = uVar25;
      *(undefined8 *)(pOVar36->m_face_uuid).Data4 = uVar18;
      dVar19 = (pOVar42->m_bbox).m_min.x;
      dVar20 = (pOVar42->m_bbox).m_min.y;
      dVar21 = (pOVar42->m_bbox).m_min.z;
      dVar22 = (pOVar42->m_bbox).m_max.x;
      dVar23 = (pOVar42->m_bbox).m_max.z;
      (pOVar36->m_bbox).m_max.y = (pOVar42->m_bbox).m_max.y;
      (pOVar36->m_bbox).m_max.z = dVar23;
      (pOVar36->m_bbox).m_min.z = dVar21;
      (pOVar36->m_bbox).m_max.x = dVar22;
      (pOVar36->m_bbox).m_min.x = dVar19;
      (pOVar36->m_bbox).m_min.y = dVar20;
      uVar18 = *(undefined8 *)&pOVar42->field_0xa0;
      *(undefined8 *)&pOVar36->field_0x98 = *(undefined8 *)&pOVar42->field_0x98;
      *(undefined8 *)&pOVar36->field_0xa0 = uVar18;
      uVar18 = *(undefined8 *)&pOVar42->field_0xb0;
      *(undefined8 *)&pOVar36->field_0xa8 = *(undefined8 *)&pOVar42->field_0xa8;
      *(undefined8 *)&pOVar36->field_0xb0 = uVar18;
      pOVar36->m_face_user = pOVar42->m_face_user;
      if (bVar27 != false) {
        bVar28 = ON_BoundingBox::IsValid(&pOVar36->m_bbox);
        if (bVar28) {
          ON_BoundingBox::Union(&sub_bbox,&pOVar36->m_bbox);
        }
        else {
          ON_BoundingBox::Destroy(&sub_bbox);
          bVar27 = false;
        }
      }
      for (lVar34 = 0; lVar34 < (pOVar42->m_li).m_count; lVar34 = lVar34 + 1) {
        iVar29 = (pOVar42->m_li).m_a[lVar34];
        pOVar31 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
        ;
        loop = NewLoop(sub_brep,pOVar31[iVar29].m_type,pOVar36);
        pOVar31 = pOVar31 + iVar29;
        ON_Object::CopyUserData((ON_Object *)loop,(ON_Object *)pOVar31);
        uVar7 = *(undefined4 *)&(pOVar31->m_pbox).m_min.x;
        uVar8 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.x + 4);
        uVar9 = *(undefined4 *)&(pOVar31->m_pbox).m_min.y;
        uVar10 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.y + 4);
        uVar11 = *(undefined4 *)&(pOVar31->m_pbox).m_min.z;
        uVar12 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_min.z + 4);
        uVar13 = *(undefined4 *)&(pOVar31->m_pbox).m_max.x;
        uVar14 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.x + 4);
        uVar15 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.y + 4);
        uVar16 = *(undefined4 *)&(pOVar31->m_pbox).m_max.z;
        uVar17 = *(undefined4 *)((long)&(pOVar31->m_pbox).m_max.z + 4);
        *(undefined4 *)&(loop->m_pbox).m_max.y = *(undefined4 *)&(pOVar31->m_pbox).m_max.y;
        *(undefined4 *)((long)&(loop->m_pbox).m_max.y + 4) = uVar15;
        *(undefined4 *)&(loop->m_pbox).m_max.z = uVar16;
        *(undefined4 *)((long)&(loop->m_pbox).m_max.z + 4) = uVar17;
        *(undefined4 *)&(loop->m_pbox).m_min.z = uVar11;
        *(undefined4 *)((long)&(loop->m_pbox).m_min.z + 4) = uVar12;
        *(undefined4 *)&(loop->m_pbox).m_max.x = uVar13;
        *(undefined4 *)((long)&(loop->m_pbox).m_max.x + 4) = uVar14;
        *(undefined4 *)&(loop->m_pbox).m_min.x = uVar7;
        *(undefined4 *)((long)&(loop->m_pbox).m_min.x + 4) = uVar8;
        *(undefined4 *)&(loop->m_pbox).m_min.y = uVar9;
        *(undefined4 *)((long)&(loop->m_pbox).m_min.y + 4) = uVar10;
        loop->m_loop_user = pOVar31->m_loop_user;
        for (lVar44 = 0; lVar44 < (pOVar31->m_ti).m_count; lVar44 = lVar44 + 1) {
          iVar29 = (pOVar31->m_ti).m_a[lVar44];
          pOVar33 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                    m_a;
          if ((__s_00[pOVar33[iVar29].m_vi[0]] < 0) ||
             (pOVar33 = pOVar33 + iVar29, __s_00[pOVar33->m_vi[1]] < 0)) goto LAB_0043427c;
          uVar30 = pOVar33->m_ei;
          if ((-1 < (long)(int)uVar30) && (__s[(int)uVar30] < 0)) goto LAB_0043427c;
          if (pOVar33->m_c2i < 0) {
            if (pOVar33->m_type != ptonsrf) goto LAB_0043427c;
          }
          else {
            iVar29 = (*(pOVar33->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                       super_ON_Object._vptr_ON_Object[0x24])(pOVar33);
            c2 = (ON_Curve *)CONCAT44(extraout_var_01,iVar29);
            if (c2 == (ON_Curve *)0x0) goto LAB_0043427c;
            ON_SimpleArray<ON_Curve_*>::Append
                      (&(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>,&c2);
            uVar30 = pOVar33->m_ei;
          }
          if ((int)uVar30 < 0) {
            if (pOVar33->m_type == ptonsrf) {
              pOVar37 = NewTrim(sub_brep,false,loop,-1);
              pOVar37->m_type = ptonsrf;
              iVar29 = (sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                       super_ON_ClassArray<ON_BrepVertex>.m_a[__s_00[pOVar33->m_vi[0]]].
                       m_vertex_index;
              pOVar37->m_vi[1] = iVar29;
              pOVar37->m_vi[0] = iVar29;
            }
            else {
              if (pOVar33->m_type != singular) goto LAB_0043427c;
              NewSingularTrim(sub_brep,(sub_brep->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                                       super_ON_ClassArray<ON_BrepVertex>.m_a +
                                       __s_00[pOVar33->m_vi[0]],loop,pOVar33->m_iso,
                              (sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count + -1);
            }
          }
          else {
            NewTrim(sub_brep,(sub_brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                             super_ON_ClassArray<ON_BrepEdge>.m_a + __s[uVar30],pOVar33->m_bRev3d,
                    loop,(sub_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count + -1);
          }
          lVar38 = (long)(sub_brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_count;
          pOVar37 = (sub_brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                    super_ON_ClassArray<ON_BrepTrim>.m_a;
          ON_Object::CopyUserData((ON_Object *)(pOVar37 + lVar38 + -1),(ON_Object *)pOVar33);
          dVar19 = pOVar33->m__legacy_3d_tol;
          pOVar37[lVar38 + -1].m__legacy_2d_tol = pOVar33->m__legacy_2d_tol;
          pOVar37[lVar38 + -1].m__legacy_3d_tol = dVar19;
          pOVar37[lVar38 + -1].m__legacy_flags = pOVar33->m__legacy_flags;
          pOVar37[lVar38 + -1].m_tolerance[0] = pOVar33->m_tolerance[0];
          pOVar37[lVar38 + -1].m_tolerance[1] = pOVar33->m_tolerance[1];
          uVar7 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_min.x + 4);
          uVar8 = *(undefined4 *)&(pOVar33->m_pbox).m_min.y;
          uVar9 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_min.y + 4);
          uVar10 = *(undefined4 *)&(pOVar33->m_pbox).m_min.z;
          uVar11 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_min.z + 4);
          uVar12 = *(undefined4 *)&(pOVar33->m_pbox).m_max.x;
          uVar13 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_max.x + 4);
          uVar14 = *(undefined4 *)&(pOVar33->m_pbox).m_max.y;
          uVar15 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_max.y + 4);
          uVar16 = *(undefined4 *)&(pOVar33->m_pbox).m_max.z;
          uVar17 = *(undefined4 *)((long)&(pOVar33->m_pbox).m_max.z + 4);
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_min.x =
               *(undefined4 *)&(pOVar33->m_pbox).m_min.x;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_min.x + 4) = uVar7;
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_min.y = uVar8;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_min.y + 4) = uVar9;
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_min.z = uVar10;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_min.z + 4) = uVar11;
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_max.x = uVar12;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_max.x + 4) = uVar13;
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_max.y = uVar14;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_max.y + 4) = uVar15;
          *(undefined4 *)&pOVar37[lVar38 + -1].m_pbox.m_max.z = uVar16;
          *(undefined4 *)((long)&pOVar37[lVar38 + -1].m_pbox.m_max.z + 4) = uVar17;
          pOVar37[lVar38 + -1].m_iso = pOVar33->m_iso;
          pOVar37[lVar38 + -1].m_trim_user = pOVar33->m_trim_user;
          if (pOVar33->m_type != mated) {
            pOVar37[lVar38 + -1].m_type = pOVar33->m_type;
          }
        }
      }
    }
    if ((bVar27 == false) || (bVar27 = ON_BoundingBox::IsValid(&sub_bbox), !bVar27)) {
      ON_Geometry::BoundingBox((ON_BoundingBox *)&srf,&sub_brep->super_ON_Geometry);
    }
    else {
      (sub_brep->m_bbox).m_max.y = sub_bbox.m_max.y;
      (sub_brep->m_bbox).m_max.z = sub_bbox.m_max.z;
      (sub_brep->m_bbox).m_min.z = sub_bbox.m_min.z;
      (sub_brep->m_bbox).m_max.x = sub_bbox.m_max.x;
      (sub_brep->m_bbox).m_min.x = sub_bbox.m_min.x;
      (sub_brep->m_bbox).m_min.y = sub_bbox.m_min.y;
    }
    local_b0.m_p = (ON_Brep *)0x0;
    local_b0.m_sub_brep = (ON_Brep *)0x0;
    local_120 = sub_brep;
  }
LAB_00434285:
  SubBrep::LeakStopper::~LeakStopper(&local_b0);
  return local_120;
}

Assistant:

ON_Brep* ON_Brep::SubBrep( 
          int subfi_count, 
          const int* subfi, 
          ON_Brep* sub_brep
          ) const
{
  class LeakStopper : public ON_Workspace
  {
    // If an error occures during construction,
    // this class cleans up sub_brep in an
    // appropriate fashion.
  public:
    LeakStopper() {m_p=0;m_sub_brep=0;}
    ~LeakStopper() {if (m_p) delete m_p; else if (m_sub_brep) m_sub_brep->Destroy();}
    ON_Brep* m_p;        // ON_Brep::SubBrep allocated sub_brep
    ON_Brep* m_sub_brep; // user's sub_brep argument
  };
  LeakStopper leak_stopper;

  if ( sub_brep )
    sub_brep->Destroy();

  if ( subfi_count <= 0 || 0 == subfi )
    return 0;

  if ( subfi_count > m_F.Count() )
    return 0;

  // validate indices in extract_fi[] and
  // make sure there are no duplicates.
  int fi, fli, lti, i, j;
  int Lcount = 0;
  int Tcount = 0;
  int Ecount = 0;
  int Vcount = 0;
  int maxfi = -1;
  int minfi = m_F.Count();
  int* Emap = leak_stopper.GetIntMemory(m_E.Count());
  memset(Emap,0,m_E.Count()*sizeof(Emap[0]));
  int* Vmap = leak_stopper.GetIntMemory(m_V.Count());
  memset(Vmap,0,m_V.Count()*sizeof(Vmap[0]));
  for ( i = 0; i < subfi_count; i++ )
  {
    fi = subfi[i];
    if ( fi < 0 || fi >= m_F.Count() )
    {
      ON_ERROR("ON_Brep::SubBrep sub_fi[] has invalid indices");
      return 0;
    }
    if ( fi > maxfi )
      maxfi = fi;
    else if ( fi < minfi )
      minfi = fi;
    else
    {
      for ( j = 0; j < i; j++ )
      {
        if ( subfi[j] == fi )
        {
          ON_ERROR("ON_Brep::SubBrep sub_fi[] has duplicate indices");
          return 0;
        }
      }
    }

    const ON_BrepFace& face = m_F[fi];
    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = face.Loop(fli);
      if ( !loop || this != loop->Brep() )
        return 0;
      Lcount++;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = loop->Trim(lti);
        if ( !trim || this != trim->Brep() )
          return 0;
        Tcount++;
        if ( trim->m_vi[0] < 0 || trim->m_vi[0] >= m_V.Count() )
          return 0;
        if ( trim->m_vi[1] < 0 || trim->m_vi[1] >= m_V.Count() )
          return 0;
        if ( 0 == Vmap[trim->m_vi[0]] )
        {
          Vmap[trim->m_vi[0]] = 1;
          Vcount++;
        }
        if ( 0 == Vmap[trim->m_vi[1]] )
        {
          Vmap[trim->m_vi[1]] = 1;
          Vcount++;
        }
        if ( ON_BrepTrim::singular == trim->m_type ||
             ON_BrepTrim::ptonsrf == trim->m_type)   // March 29, 2010 Lowell - Allow ptonsrf
        {
          if ( trim->m_ei >= 0 || trim->m_vi[0] != trim->m_vi[1] )
            return 0;
        }
        else if ( trim->m_ei >= 0 )
        {
          const ON_BrepEdge* edge = trim->Edge();
          if ( 0 == edge || this != edge->Brep() )
            return 0;
          if ( 0 == Emap[trim->m_ei] )
          {
            Emap[trim->m_ei] = 1;
            Ecount++;
            // edge's vertices should already be mapped.
            if ( 0 == Vmap[edge->m_vi[0]] )
              return 0;
            if ( 0 == Vmap[edge->m_vi[1]] )
              return 0;
          }          
        }
        else
        {
          return 0;
        }
      }
    }
  }

  if ( !sub_brep )
  {
    sub_brep = ON_Brep::New();
    leak_stopper.m_p = sub_brep;
  }
  else
  {
    leak_stopper.m_sub_brep = sub_brep;
  }

  sub_brep->m_F.Reserve(subfi_count);
  sub_brep->m_L.Reserve(Lcount);
  sub_brep->m_T.Reserve(Tcount);
  sub_brep->m_E.Reserve(Ecount);
  sub_brep->m_V.Reserve(Vcount);
  sub_brep->m_S.Reserve(subfi_count);
  sub_brep->m_C2.Reserve(Tcount);
  sub_brep->m_C3.Reserve(Ecount);

  // build sub_brep vertices
  for ( i = 0; i < m_V.Count(); i++ )
  {
    if ( Vmap[i] )
    {
      const ON_BrepVertex& vertex = m_V[i];
      ON_BrepVertex& sub_vertex = sub_brep->NewVertex(vertex.point,vertex.m_tolerance);
      Vmap[i] = sub_vertex.m_vertex_index;
      sub_vertex.CopyUserData(vertex);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_vertex.m_vertex_user, &vertex.m_vertex_user, sizeof(sub_vertex.m_vertex_user));
    }
    else
      Vmap[i] = -1;
  }

  // build sub_brep edges
  for ( i = 0; i < m_E.Count(); i++ )
  {
    if ( Emap[i] )
    {
      const ON_BrepEdge& edge = m_E[i];
      if ( Vmap[edge.m_vi[0]] < 0 )
        return 0;
      if ( Vmap[edge.m_vi[1]] < 0 )
        return 0;
      ON_Curve* c3 = edge.DuplicateCurve();
      if ( 0 == c3 )
        return 0;
      sub_brep->m_C3.Append(c3);
      ON_BrepVertex& sub_v0 = sub_brep->m_V[Vmap[edge.m_vi[0]]];
      ON_BrepVertex& sub_v1 = sub_brep->m_V[Vmap[edge.m_vi[1]]];
      ON_BrepEdge& sub_edge = sub_brep->NewEdge(sub_v0,sub_v1,sub_brep->m_C3.Count()-1,0,edge.m_tolerance);
      Emap[i] = sub_edge.m_edge_index;
      sub_edge.CopyUserData(edge);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_edge.m_edge_user, &edge.m_edge_user, sizeof(sub_edge.m_edge_user));
    }
    else
      Emap[i] = -1;
  }

  bool bHaveBBox = m_bbox.IsValid();
  ON_BoundingBox sub_bbox;

  for ( i = 0; i < subfi_count; i++ )
  {
    const ON_BrepFace& face = m_F[subfi[i]];
    ON_Surface* srf = face.DuplicateSurface();
    if (!srf)
      return 0;
    sub_brep->m_S.Append(srf);
    ON_BrepFace& sub_face = sub_brep->NewFace(sub_brep->m_S.Count()-1);
    sub_face.CopyUserData(face);
    sub_face.m_bRev = face.m_bRev;
    sub_face.m_face_material_channel = face.m_face_material_channel;
    sub_face.m_face_uuid = face.m_face_uuid;
    sub_face.m_bbox = face.m_bbox;
    sub_face.m_domain[0] = face.m_domain[0];
    sub_face.m_domain[1] = face.m_domain[1];
    // March 29, 2010 Lowell - Copy user fields
    memcpy(&sub_face.m_face_user, &face.m_face_user, sizeof(sub_face.m_face_user));

    if ( bHaveBBox )
    {
      if ( sub_face.m_bbox.IsValid() )
        sub_bbox.Union(sub_face.m_bbox);
      else
      {
        bHaveBBox = false;
        sub_bbox.Destroy();
      }
    }


    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop& loop = m_L[face.m_li[fli]];
      ON_BrepLoop& sub_loop = sub_brep->NewLoop(loop.m_type,sub_face);
      sub_loop.CopyUserData(loop);
      sub_loop.m_pbox = loop.m_pbox;
      // April 19, 2010 Lowell - Copy user fields
      memcpy(&sub_loop.m_loop_user, &loop.m_loop_user, sizeof(sub_loop.m_loop_user));

      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
        if ( Vmap[trim.m_vi[0]] < 0 || Vmap[trim.m_vi[1]] < 0 )
          return 0;
        if ( trim.m_ei >= 0 && Emap[trim.m_ei] < 0 )
          return 0;
        if(trim.m_c2i >= 0)
        {
          ON_Curve* c2 = trim.DuplicateCurve();
          if ( !c2 )
            return 0;
          sub_brep->m_C2.Append(c2);
        }
        else if(trim.m_type != ON_BrepTrim::ptonsrf)
          return 0;
        if ( trim.m_ei >= 0 )
        {
          ON_BrepEdge& sub_edge = sub_brep->m_E[Emap[trim.m_ei]];
          sub_brep->NewTrim(sub_edge,trim.m_bRev3d,sub_loop,sub_brep->m_C2.Count()-1);
        }
        else if ( ON_BrepTrim::singular == trim.m_type )
        {
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_brep->NewSingularTrim(sub_vertex,sub_loop,trim.m_iso,sub_brep->m_C2.Count()-1);
        }
        // March 29, 2010 Lowell - copy ptonsrf type
        else if ( ON_BrepTrim::ptonsrf == trim.m_type)
        {
          ON_BrepTrim& sub_trim = sub_brep->NewTrim(false, sub_loop, -1);
          sub_trim.m_type = ON_BrepTrim::ptonsrf;
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_trim.m_vi[0] = sub_trim.m_vi[1] = sub_vertex.m_vertex_index;
        }
        else
        {
          return 0;
        }
        ON_BrepTrim& sub_trim = sub_brep->m_T[sub_brep->m_T.Count()-1];
        sub_trim.CopyUserData(trim);
        sub_trim.m__legacy_2d_tol = trim.m__legacy_2d_tol;
        sub_trim.m__legacy_3d_tol = trim.m__legacy_3d_tol;
        sub_trim.m__legacy_flags = trim.m__legacy_flags;
        sub_trim.m_tolerance[0] = trim.m_tolerance[0];
        sub_trim.m_tolerance[1] = trim.m_tolerance[1];
        sub_trim.m_pbox = trim.m_pbox;
        sub_trim.m_iso = trim.m_iso;
        // April 19, 2010 Lowell - Copy user fields
        memcpy(&sub_trim.m_trim_user, &trim.m_trim_user, sizeof(sub_trim.m_trim_user));

        // Since we are extracting a subset of the original brep,
        // some mated edges could turn into boundary edges. The
        // call to NewTrim() above will correctly handle setting
        // and updating sub_trims that came from mated trims.
        if ( ON_BrepTrim::mated != trim.m_type )
          sub_trim.m_type = trim.m_type;
      }
    }
  }

  if ( !bHaveBBox || !sub_bbox.IsValid() )
    sub_brep->BoundingBox();
  else
    sub_brep->m_bbox = sub_bbox;

  // return subbrep after disabling the leak stopper
  leak_stopper.m_p = 0;
  leak_stopper.m_sub_brep = 0;
  return sub_brep;
}